

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O2

JsonArray * __thiscall Json::JsonDocument::array(JsonDocument *this)

{
  element_type *peVar1;
  bool bVar2;
  JsonArray *pJVar3;
  
  bVar2 = isArray(this);
  if ((bVar2) &&
     (peVar1 = (this->jsonValuePtr).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    pJVar3 = (JsonArray *)__dynamic_cast(peVar1,&JsonValue::typeinfo,&JsonArray::typeinfo,0);
    return pJVar3;
  }
  return (JsonArray *)0x0;
}

Assistant:

JsonArray *JsonDocument::array() {
        if (!isArray())return nullptr;
        return dynamic_cast<JsonArray *>(jsonValuePtr.get());
    }